

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unpack.c
# Opt level: O0

msgpack_unpack_return msgpack_unpacker_next(msgpack_unpacker *mpac,msgpack_unpacked *result)

{
  msgpack_unpack_return mVar1;
  int ret;
  msgpack_unpacked *result_local;
  msgpack_unpacker *mpac_local;
  
  mVar1 = unpacker_next(mpac,result);
  if (mVar1 == MSGPACK_UNPACK_SUCCESS) {
    msgpack_unpacker_reset(mpac);
  }
  return mVar1;
}

Assistant:

msgpack_unpack_return msgpack_unpacker_next(msgpack_unpacker* mpac,
                                            msgpack_unpacked* result)
{
    int ret;

    ret = unpacker_next(mpac, result);
    if (ret == MSGPACK_UNPACK_SUCCESS) {
        msgpack_unpacker_reset(mpac);
    }

    return ret;
}